

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

SQChar * __thiscall SQSharedState::GetScratchPad(SQSharedState *this,SQInteger size)

{
  void *pvVar1;
  SQAllocContext p;
  void *p_00;
  SQAllocContext in_RSI;
  SQUnsignedInteger in_RDI;
  SQInteger newsize;
  SQUnsignedInteger in_stack_ffffffffffffffd8;
  
  if (0 < (long)in_RSI) {
    if (*(long *)(in_RDI + 0x1b0) < (long)in_RSI) {
      p = in_RSI + ((long)in_RSI >> 1);
      pvVar1 = sq_vm_realloc(in_RSI,p,in_RDI,in_stack_ffffffffffffffd8);
      *(void **)(in_RDI + 0x1a8) = pvVar1;
      *(SQAllocContext *)(in_RDI + 0x1b0) = p;
    }
    else if ((long)in_RSI * 0x20 <= *(long *)(in_RDI + 0x1b0)) {
      p_00 = (void *)(*(long *)(in_RDI + 0x1b0) >> 1);
      pvVar1 = sq_vm_realloc(in_RSI,p_00,in_RDI,in_stack_ffffffffffffffd8);
      *(void **)(in_RDI + 0x1a8) = pvVar1;
      *(void **)(in_RDI + 0x1b0) = p_00;
    }
  }
  return *(SQChar **)(in_RDI + 0x1a8);
}

Assistant:

SQChar* SQSharedState::GetScratchPad(SQInteger size)
{
    SQInteger newsize;
    if(size>0) {
        if(_scratchpadsize < size) {
            newsize = size + (size>>1);
            _scratchpad = (SQChar *)SQ_REALLOC(_alloc_ctx, _scratchpad, _scratchpadsize, newsize);
            _scratchpadsize = newsize;

        }else if(_scratchpadsize >= (size<<5)) {
            newsize = _scratchpadsize >> 1;
            _scratchpad = (SQChar *)SQ_REALLOC(_alloc_ctx, _scratchpad, _scratchpadsize, newsize);
            _scratchpadsize = newsize;
        }
    }
    return _scratchpad;
}